

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAddEaRg<(moira::Instr)118,(moira::Mode)2,(moira::Size)2>(Moira *this,u16 opcode)

{
  ushort uVar1;
  bool bVar2;
  u32 uVar3;
  ulong uVar4;
  ulong uVar5;
  u32 data;
  u32 ea;
  uint local_20;
  u32 local_1c;
  
  bVar2 = readOp<(moira::Mode)2,(moira::Size)2,0ul>(this,opcode & 7,&local_1c,&local_20);
  if (bVar2) {
    uVar4 = (ulong)(opcode >> 9 & 7);
    uVar1 = *(ushort *)((long)this->exec + uVar4 * 4 + -0x58);
    uVar5 = (ulong)uVar1 - (ulong)local_20;
    bVar2 = (bool)((byte)(uVar5 >> 0x10) & 1);
    (this->reg).sr.c = bVar2;
    (this->reg).sr.x = bVar2;
    (this->reg).sr.v = (bool)((byte)(((local_20 ^ uVar1) & ((uint)uVar5 ^ (uint)uVar1)) >> 0xf) & 1)
    ;
    (this->reg).sr.z = (short)uVar5 == 0;
    (this->reg).sr.n = (bool)((byte)(uVar5 >> 0xf) & 1);
    uVar3 = (this->reg).pc;
    (this->reg).pc0 = uVar3;
    (this->queue).ird = (this->queue).irc;
    uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar3 + 2);
    (this->queue).irc = (u16)uVar3;
    *(short *)((long)this->exec + uVar4 * 4 + -0x58) = (short)uVar5;
  }
  return;
}

Assistant:

void
Moira::execAddEaRg(u16 opcode)
{
    u32 ea, data, result;
    
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);
    
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;
    
    result = addsub<I,S>(data, readD<S>(dst));
    prefetch<POLLIPL>();
    
    if (S == Long) sync(2 + (isMemMode(M) ? 0 : 2));
    writeD<S>(dst, result);
}